

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_uri(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing uri : 13 of 18 functions ...\n");
  }
  iVar1 = test_xmlBuildRelativeURI();
  iVar2 = test_xmlBuildRelativeURISafe();
  iVar3 = test_xmlBuildURI();
  iVar4 = test_xmlBuildURISafe();
  iVar5 = test_xmlCanonicPath();
  iVar6 = test_xmlCreateURI();
  iVar7 = test_xmlNormalizeURIPath();
  iVar8 = test_xmlParseURI();
  iVar9 = test_xmlParseURIRaw();
  iVar10 = test_xmlParseURIReference();
  iVar11 = test_xmlParseURISafe();
  iVar12 = test_xmlPathToURI();
  iVar13 = test_xmlPrintURI();
  iVar14 = test_xmlSaveUri();
  iVar15 = test_xmlURIEscape();
  iVar16 = test_xmlURIEscapeStr();
  iVar17 = test_xmlURIUnescapeString();
  uVar18 = iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + 
                                                  iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + 
                                                  iVar1;
  if (uVar18 != 0) {
    printf("Module uri: %d errors\n",(ulong)uVar18);
  }
  return uVar18;
}

Assistant:

static int
test_uri(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing uri : 13 of 18 functions ...\n");
    test_ret += test_xmlBuildRelativeURI();
    test_ret += test_xmlBuildRelativeURISafe();
    test_ret += test_xmlBuildURI();
    test_ret += test_xmlBuildURISafe();
    test_ret += test_xmlCanonicPath();
    test_ret += test_xmlCreateURI();
    test_ret += test_xmlNormalizeURIPath();
    test_ret += test_xmlParseURI();
    test_ret += test_xmlParseURIRaw();
    test_ret += test_xmlParseURIReference();
    test_ret += test_xmlParseURISafe();
    test_ret += test_xmlPathToURI();
    test_ret += test_xmlPrintURI();
    test_ret += test_xmlSaveUri();
    test_ret += test_xmlURIEscape();
    test_ret += test_xmlURIEscapeStr();
    test_ret += test_xmlURIUnescapeString();

    if (test_ret != 0)
	printf("Module uri: %d errors\n", test_ret);
    return(test_ret);
}